

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  CircularArray<wabt::Token,_2UL> *this_00;
  undefined8 uVar1;
  Location loc;
  undefined8 uVar2;
  reference pvVar3;
  int iVar4;
  bool bVar5;
  Token cur;
  Token local_70;
  
  this_00 = &this->tokens_;
  do {
    while( true ) {
      while( true ) {
        if (n < (this->tokens_).size_) {
          pvVar3 = CircularArray<wabt::Token,_2UL>::at(this_00,n);
          return pvVar3->token_type_;
        }
        WastLexer::GetToken(&cur,this->lexer_,this);
        if (cur.token_type_ == LparAnn) break;
        CircularArray<wabt::Token,_2UL>::push_back(this_00,&cur);
      }
      if ((this->options_->features).annotations_enabled_ == true) break;
      Token::to_string_abi_cxx11_((string *)&local_70,&cur);
      Error(this,0x1ae0e7,local_70.loc.filename.data_);
      std::__cxx11::string::_M_dispose();
      loc.filename.size_._0_4_ = (int)cur.loc.filename.size_;
      loc.filename.data_ = cur.loc.filename.data_;
      loc.filename.size_._4_4_ = (int)(cur.loc.filename.size_ >> 0x20);
      loc.field_1.field_0.line = cur.loc.field_1._0_4_;
      loc.field_1.field_0.first_column = cur.loc.field_1._4_4_;
      loc.field_1.field_0.last_column = (int)cur.loc.field_1._8_8_;
      loc.field_1._12_4_ = (int)((ulong)cur.loc.field_1._8_8_ >> 0x20);
      Token::Token(&local_70,loc,First);
      CircularArray<wabt::Token,_2UL>::push_back(this_00,&local_70);
    }
    iVar4 = 1;
    while (0 < iVar4) {
      WastLexer::GetToken(&local_70,this->lexer_,this);
      cur.loc.filename.data_ = local_70.loc.filename.data_;
      cur.loc.filename.size_ = local_70.loc.filename.size_;
      cur.loc.field_1.field_1.offset = local_70.loc.field_1.field_1.offset;
      cur.loc.field_1._8_8_ = local_70.loc.field_1._8_8_;
      uVar1._0_4_ = local_70.token_type_;
      uVar1._4_4_ = local_70._36_4_;
      cur.field_2.text_.data_ = local_70.field_2.text_.data_;
      cur.field_2.text_.size_ = local_70.field_2.text_.size_;
      cur.field_2.literal_.text.size_ = local_70.field_2.literal_.text.size_;
      cur.token_type_ = local_70.token_type_;
      cur._36_4_ = local_70._36_4_;
      uVar2 = cur._32_8_;
      cur.token_type_ = local_70.token_type_;
      if (cur.token_type_ == LparAnn) {
LAB_001791f2:
        iVar4 = iVar4 + 1;
        cur._32_8_ = uVar2;
      }
      else if (cur.token_type_ == Rpar) {
        iVar4 = iVar4 + -1;
        cur._32_8_ = uVar2;
      }
      else {
        bVar5 = cur.token_type_ == Lpar;
        cur._32_8_ = uVar1;
        if (bVar5) goto LAB_001791f2;
      }
    }
  } while( true );
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken(this);
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken(this);
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}